

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

double inverf(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dt;
  double t;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = 1.0;
  local_10 = in_XMM0_Qa;
  while (1.1920928955078125e-07 < ABS(local_18)) {
    dVar1 = sqrt(3.141592653589793);
    dVar2 = erf(local_10);
    local_18 = exp(-local_10 * local_10);
    local_18 = (dVar1 * 0.5 * (dVar2 - in_XMM0_Qa)) / local_18;
    local_10 = local_10 - local_18;
  }
  return local_10;
}

Assistant:

double inverf(double x)
{   // compute the inverse error function via newton's method
    double t = x, dt = 1;
    while (fabs(dt) > FLT_EPSILON)
    {
        dt = 0.5 * sqrt(PI) * (erf(t) - x) / exp(-t*t);
        t -= dt;
    }
    return t;
}